

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall
leveldb::CorruptionTest_Recovery_Test::~CorruptionTest_Recovery_Test
          (CorruptionTest_Recovery_Test *this)

{
  CorruptionTest_Recovery_Test *this_local;
  
  ~CorruptionTest_Recovery_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CorruptionTest, Recovery) {
  Build(100);
  Check(100, 100);
  Corrupt(kLogFile, 19, 1);  // WriteBatch tag for first record
  Corrupt(kLogFile, log::kBlockSize + 1000, 1);  // Somewhere in second block
  Reopen();

  // The 64 records in the first two log blocks are completely lost.
  Check(36, 36);
}